

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O3

void solver_debug_check_clauses(solver_t *s)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  clause_conflict *clause;
  
  fprintf(_stdout,"[Satoko] Checking clauses (%d)...\n",(ulong)s->originals->size);
  uVar2 = (ulong)s->originals->size;
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      uVar3 = (ulong)s->originals->data[uVar6];
      if (uVar3 == 0xffffffff) {
        clause = (clause_conflict *)0x0;
      }
      else {
        clause = (clause_conflict *)(s->all_clauses->data + uVar3);
      }
      uVar1 = clause->size;
      if ((ulong)uVar1 == 0) {
        uVar3 = 0;
      }
      else {
        uVar4 = (ulong)s->trail->size;
        uVar3 = 0;
        while (uVar4 != 0) {
          uVar5 = 0;
          while ((s->trail->data[uVar5] ^ *(uint *)(&clause[1].field_0x0 + uVar3 * 4)) != 1) {
            uVar5 = uVar5 + 1;
            if (uVar4 == uVar5) goto LAB_0090a53e;
          }
          uVar3 = uVar3 + 1;
          if (uVar3 == uVar1) goto LAB_0090a572;
        }
      }
LAB_0090a53e:
      if ((uint)uVar3 == uVar1) {
LAB_0090a572:
        vec_uint_print(s->trail);
        fprintf(_stdout,"[Satoko] FOUND UNSAT CLAUSE]: (%d) ",uVar6 & 0xffffffff);
        clause_print(clause);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                      ,0x2e7,"void solver_debug_check_clauses(solver_t *)");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  fwrite("[Satoko] All SAT - OK\n",0x16,1,_stdout);
  return;
}

Assistant:

void solver_debug_check_clauses(solver_t *s)
{
    unsigned cref, i;

    fprintf(stdout, "[Satoko] Checking clauses (%d)...\n", vec_uint_size(s->originals));
    vec_uint_foreach(s->originals, cref, i) {
        unsigned j;
        struct clause *clause = clause_fetch(s, cref);
        for (j = 0; j < clause->size; j++) {
            if (vec_uint_find(s->trail, lit_compl(clause->data[j].lit))) {
                continue;
            }
            break;
        }
        if (j == clause->size) {
            vec_uint_print(s->trail);
            fprintf(stdout, "[Satoko] FOUND UNSAT CLAUSE]: (%d) ", i);
            clause_print(clause);
            assert(0);
        }
    }
    fprintf(stdout, "[Satoko] All SAT - OK\n");
}